

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  undefined1 local_8070 [8];
  Poller po;
  TcpListener tl;
  
  local_8070 = (undefined1  [8])&PTR__Poller_00107bc0;
  po.context = (EventContext *)&PTR__MemPoolC_00107bf0;
  po.buffPool._vptr_MemPoolC._0_4_ = 0;
  memset(&po.buffPool.count_,0,0x8000);
  Poller::Init((Poller *)local_8070,0x400,10);
  tl.super_PollObj._vptr_PollObj = (_func_int **)0x0;
  po.buffPool.objs_._M_elems[0xfff] = (BufferChain *)&PTR__TcpListener_00107c88;
  TcpSocket::TcpSocket((TcpSocket *)&tl.super_PollObj.m_pPoller);
  TcpListener::Listen((TcpListener *)(po.buffPool.objs_._M_elems + 0xfff),0x22b0);
  Poller::Add((Poller *)local_8070,(PollObj *)(po.buffPool.objs_._M_elems + 0xfff),0x11);
  do {
    Poller::Process((Poller *)local_8070);
  } while( true );
}

Assistant:

int main() {
    Poller po;
    po.Init(1024, 10);
    TcpListener tl;
    tl.Listen(8880);
    po.Add(&tl, EV_READ|EV_ET);
    while (true)
    {
        po.Process();
    }
    


    return 0;
}